

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::PagesConfig::endPages(PagesConfig *this)

{
  element_type *peVar1;
  Config *pCVar2;
  allocator<char> local_31;
  string local_30;
  
  pCVar2 = this->config;
  peVar1 = (pCVar2->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(pointer *)
       ((long)&(peVar1->page_specs).
               super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
               super__Vector_impl_data + 8) ==
      (peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"--pages: no page specifications given",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = this->config;
  }
  return pCVar2;
}

Assistant:

QPDFJob::Config*
QPDFJob::PagesConfig::endPages()
{
    auto n_specs = config->o.m->page_specs.size();
    if (n_specs == 0) {
        usage("--pages: no page specifications given");
    }
    return this->config;
}